

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O0

void TR_Exp(ast *node,C_OP *place)

{
  int iVar1;
  ast *place_00;
  ast *paVar2;
  ast *in_RSI;
  ast *in_RDI;
  ast *c1;
  ast *c2;
  C_OP *in_stack_000000a8;
  ast *in_stack_000000b0;
  C_OP *in_stack_000000d8;
  ast *in_stack_000000e0;
  C_OP *in_stack_00000368;
  ast *in_stack_00000370;
  C_OP *in_stack_000003c8;
  ast *in_stack_000003d0;
  C_OP *in_stack_000003f8;
  ast *in_stack_00000400;
  C_OP *in_stack_00000408;
  ast *in_stack_00000410;
  
  place_00 = child(in_RDI,2);
  paVar2 = child(in_RDI,1);
  if (place_00 == (ast *)0x0) {
    if (paVar2->type == 0x102) {
      TR_INT(in_stack_000000e0,in_stack_000000d8);
    }
    else {
      if (paVar2->type != 0x11c) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                      ,0x228,"void TR_Exp(ast *, C_OP &)");
      }
      TR_ID(in_stack_00000410,in_stack_00000408);
    }
  }
  else {
    if (place_00->type != 0x112) {
      IrSim::resetCurDim(&irSim);
    }
    iVar1 = place_00->type;
    if (iVar1 == -0x26fd) {
      iVar1 = paVar2->type;
      if (iVar1 == 0x109) {
        TR_MINUS(in_stack_000000b0,in_stack_000000a8);
      }
      else if (iVar1 == 0x10f) {
        TR_ARITH(in_stack_000003d0,in_stack_000003c8);
      }
      else {
        if (iVar1 != 0x110) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tangruize[P]Compiler/src/ir.cpp"
                        ,0x21b,"void TR_Exp(ast *, C_OP &)");
        }
        TR_Exp(in_RSI,(C_OP *)place_00);
      }
    }
    else if (iVar1 == 0x106) {
      TR_ASSIGNOP(in_stack_00000400,in_stack_000003f8);
    }
    else {
      if (iVar1 == 0x10e) {
        std::operator<<((ostream *)&std::cerr,"Structure not implemented!\n");
        exit(1);
      }
      if (iVar1 == 0x110) {
        TR_CallFunc(in_stack_00000400,in_stack_000003f8);
      }
      else if (iVar1 == 0x112) {
        TR_LB(in_stack_00000370,in_stack_00000368);
      }
      else {
        TR_ARITH(in_stack_000003d0,in_stack_000003c8);
      }
    }
  }
  return;
}

Assistant:

static void TR_Exp(ast *node, C_OP &place) {
    ast *c2 = child(node, 2), *c1 = child(node, 1);
    if (c2) {
        if (c2->type != LB) irSim.resetCurDim();
        switch (c2->type) {
            default:            TR_ARITH(c2, place);    break;
            case ASSIGNOP:      TR_ASSIGNOP(c2, place); break;
            case LP:            TR_CallFunc(c2, place); break;
            case Exp:
                switch (c1->type) {
                    case MINUS: TR_MINUS(c1, place);    break;
                    case LP:    TR_Exp(c2, place);      break;
                    case NOT:   TR_ARITH(c1, place);    break;
                    default:    assert(false);
                }
                break;
            case LB:            TR_LB(c2, place);       break;
            case DOT: /* TODO: Struct */
                IMP_ME("Structure");
                break;
        }
    }
    else {
        switch (c1->type) {
            case ID:  TR_ID(c1, place);  break;
            case INT: TR_INT(c1, place); break;
            default:  assert(false);
        }
    }
}